

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  Storage SVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  CompatibilityTestType CVar5;
  int extraout_EAX;
  reference pvVar6;
  DrawTest *this_00;
  RenderContext *renderCtx;
  char *name;
  char *desc;
  byte local_2cd;
  string local_230;
  string local_210;
  uint *local_1f0;
  deUint32 *local_1e8;
  _Self local_1e0;
  _Self local_1d8;
  int local_1cc;
  uint local_1c8;
  int attrNdx_1;
  deUint32 hash;
  OutputType local_1bc;
  AttributeSpec attribSpec;
  bool valid;
  int attrNdx;
  undefined1 local_188 [8];
  DrawTestSpec spec;
  int attributeCount;
  undefined1 local_124 [8];
  Random random;
  int ndx;
  size_t insertedCount;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  UniformWeightArray<9> usageWeights;
  UniformWeightArray<12> outputTypeWeights;
  UniformWeightArray<11> inputTypeWeights;
  UniformWeightArray<2> storageWeights;
  UniformWeightArray<3> indexTypeWeights;
  UniformWeightArray<5> drawMethodWeights;
  UniformWeightArray<7> primitiveWeights;
  int numAttempts;
  RandomGroup *this_local;
  
  UniformWeightArray<7>::UniformWeightArray
            ((UniformWeightArray<7> *)(drawMethodWeights.weights + 3));
  UniformWeightArray<5>::UniformWeightArray((UniformWeightArray<5> *)(indexTypeWeights.weights + 1))
  ;
  UniformWeightArray<3>::UniformWeightArray((UniformWeightArray<3> *)&storageWeights);
  UniformWeightArray<2>::UniformWeightArray((UniformWeightArray<2> *)(inputTypeWeights.weights + 9))
  ;
  UniformWeightArray<11>::UniformWeightArray
            ((UniformWeightArray<11> *)(outputTypeWeights.weights + 10));
  UniformWeightArray<12>::UniformWeightArray((UniformWeightArray<12> *)(usageWeights.weights + 7));
  UniformWeightArray<9>::UniformWeightArray
            ((UniformWeightArray<9> *)
             &insertedHashes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &insertedCount);
  stack0xfffffffffffffef0 = 0;
  for (random.m_rnd.z = 0; (int)random.m_rnd.z < 300; random.m_rnd.z = random.m_rnd.z + 1) {
    de::Random::Random((Random *)local_124,random.m_rnd.z + 0xc551393);
    spec.attribs.
    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_124,init::attribCounts,(int *)init::attribWeights,
                    init::attribWeights);
    deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_188);
    local_188._0_4_ = glu::ApiType::es(3,0);
    local_188._4_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive_const*,float_const*>
                   ((Random *)local_124,init::primitives,(Primitive *)&DAT_012aa73c,
                    drawMethodWeights.weights + 3);
    spec.apiType.m_bits =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_124,init::primitiveCounts,(int *)init::primitiveCountWeights,
                    init::primitiveCountWeights);
    spec.primitive =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod_const*,float_const*>
                   ((Random *)local_124,init::drawMethods,init::indexTypes,
                    indexTypeWeights.weights + 1);
    spec.primitiveCount =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType_const*,float_const*>
                   ((Random *)local_124,init::indexTypes,init::storages,storageWeights.weights);
    spec.drawMethod =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_124,init::indexOffsets,(int *)init::indexOffsetWeights,
                    init::indexOffsetWeights);
    spec.indexType =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage_const*,float_const*>
                   ((Random *)local_124,init::storages,(Storage *)&DAT_012aa768,
                    inputTypeWeights.weights + 9);
    spec.indexPointerOffset =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_124,init::firsts,(int *)init::firstWeights,init::firstWeights);
    spec.indexStorage =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_124,init::indexMins,init::indexMaxs,init::indexWeights);
    spec.first = de::Random::chooseWeighted<int,int_const*,float_const*>
                           ((Random *)local_124,init::indexMaxs,(int *)init::indexWeights,
                            init::indexWeights);
    spec.indexMin =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_124,init::instanceCounts,(int *)init::instanceWeights,
                    init::instanceWeights);
    bVar2 = deqp::gls::DrawTestSpec::valid((DrawTestSpec *)local_188);
    if (bVar2) {
      attribSpec.useDefaultAttribute = false;
      attribSpec.additionalPositionAttribute = false;
      attribSpec.bgraComponentOrder = false;
      attribSpec._39_1_ = 0;
      while ((int)attribSpec._36_4_ <
             (int)spec.attribs.
                  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec((AttributeSpec *)&hash);
        hash = de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType_const*,float_const*>
                         ((Random *)local_124,init::inputTypes,(InputType *)&DAT_012aa79c,
                          outputTypeWeights.weights + 10);
        local_1bc = de::Random::
                    chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType_const*,float_const*>
                              ((Random *)local_124,init::outputTypes,init::usages,
                               usageWeights.weights + 7);
        attribSpec.inputType =
             de::Random::
             chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage_const*,float_const*>
                       ((Random *)local_124,init::storages,(Storage *)&DAT_012aa768,
                        inputTypeWeights.weights + 9);
        attribSpec.outputType =
             de::Random::
             chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage_const*,float_const*>
                       ((Random *)local_124,init::usages,init::blacklistedCases,
                        (float *)&insertedHashes._M_t._M_impl.super__Rb_tree_header._M_node_count);
        attribSpec.storage = de::Random::getInt((Random *)local_124,1,4);
        attribSpec.usage =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)local_124,init::offsets,(int *)init::offsetWeights,
                        init::offsetWeights);
        attribSpec.componentCount =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)local_124,init::strides,(int *)init::strideWeights,
                        init::strideWeights);
        attribSpec.offset._0_1_ = de::Random::getBool((Random *)local_124);
        attribSpec.stride =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)local_124,init::instanceDivisors,
                        (int *)init::instanceDivisorWeights,init::instanceDivisorWeights);
        attribSpec.normalize = de::Random::getBool((Random *)local_124);
        attrNdx_1 = local_188._0_4_;
        attribSpec.instanceDivisor._3_1_ =
             deqp::gls::DrawTestSpec::AttributeSpec::valid
                       ((AttributeSpec *)&hash,(ApiType)local_188._0_4_);
        SVar1 = attribSpec.storage;
        if ((attribSpec.componentCount != 0) &&
           (iVar3 = deqp::gls::DrawTestSpec::inputTypeSize(hash),
           attribSpec.componentCount < (int)(SVar1 * iVar3))) {
          attribSpec.instanceDivisor._3_1_ = 0;
        }
        if ((attribSpec.instanceDivisor._3_1_ & 1) != 0) {
          std::
          vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
          ::push_back((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                       *)&spec.baseVertex,(value_type *)&hash);
          attribSpec._36_4_ = attribSpec._36_4_ + 1;
        }
      }
      if (local_188._4_4_ != PRIMITIVE_POINTS) {
        pvVar6 = std::
                 vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                               *)&spec.baseVertex,0);
        pvVar6->instanceDivisor = 0;
      }
      if (((((spec.primitive != PRIMITIVE_LINES) || (spec.indexStorage != spec.first)) ||
           (local_188._4_4_ == PRIMITIVE_POINTS)) &&
          ((pvVar6 = std::
                     vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                     ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                   *)&spec.baseVertex,0), (pvVar6->useDefaultAttribute & 1U) == 0 ||
           (local_188._4_4_ == PRIMITIVE_POINTS)))) &&
         (((local_188._4_4_ != PRIMITIVE_TRIANGLES &&
           ((local_188._4_4_ != PRIMITIVE_TRIANGLE_FAN &&
            (local_188._4_4_ != PRIMITIVE_TRIANGLE_STRIP)))) ||
          ((pvVar6 = std::
                     vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                     ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                   *)&spec.baseVertex,0), pvVar6->componentCount != 1 &&
           ((((pvVar6 = std::
                        vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                        ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                      *)&spec.baseVertex,0), pvVar6->outputType != OUTPUTTYPE_FLOAT
              && (pvVar6 = std::
                           vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                           ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                         *)&spec.baseVertex,0), pvVar6->outputType != OUTPUTTYPE_INT
                 )) && (pvVar6 = std::
                                 vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                 ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                               *)&spec.baseVertex,0),
                       pvVar6->outputType != OUTPUTTYPE_UINT)) &&
            ((spec.primitive != PRIMITIVE_LINES || (1 < (int)(spec.first - spec.indexStorage))))))))
          ))) {
        local_1c8 = deqp::gls::DrawTestSpec::hash((DrawTestSpec *)local_188);
        for (local_1cc = 0;
            local_1cc <
            (int)spec.attribs.
                 super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage; local_1cc = local_1cc + 1) {
          uVar4 = local_1c8 << 2;
          pvVar6 = std::
                   vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                   ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                 *)&spec.baseVertex,(long)local_1cc);
          local_1c8 = deqp::gls::DrawTestSpec::AttributeSpec::hash(pvVar6);
          local_1c8 = uVar4 ^ local_1c8;
        }
        local_1d8._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&insertedCount,&local_1c8);
        local_1e0._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&insertedCount);
        bVar2 = std::operator==(&local_1d8,&local_1e0);
        if (bVar2) {
          CVar5 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_188);
          local_2cd = 0;
          if (CVar5 != COMPATIBILITY_UNALIGNED_OFFSET) {
            CVar5 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_188);
            local_2cd = 0;
            if (CVar5 != COMPATIBILITY_UNALIGNED_STRIDE) {
              local_1e8 = init::blacklistedCases;
              local_1f0 = &DAT_012aa7f8;
              bVar2 = de::contains<unsigned_int_const*,unsigned_int>
                                (&local_1e8,&local_1f0,&local_1c8);
              local_2cd = bVar2 ^ 0xff;
            }
          }
          if ((local_2cd & 1) != 0) {
            this_00 = (DrawTest *)operator_new(0x138);
            testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            renderCtx = Context::getRenderContext((this->super_TestCaseGroup).m_context);
            de::toString<unsigned_long>(&local_210,(unsigned_long *)&random.m_rnd.w);
            name = (char *)std::__cxx11::string::c_str();
            deqp::gls::DrawTestSpec::getDesc_abi_cxx11_(&local_230,(DrawTestSpec *)local_188);
            desc = (char *)std::__cxx11::string::c_str();
            deqp::gls::DrawTest::DrawTest
                      (this_00,testCtx,renderCtx,(DrawTestSpec *)local_188,name,desc);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&local_210);
          }
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &insertedCount,&local_1c8);
          register0x00000000 = stack0xfffffffffffffef0 + 1;
        }
      }
    }
    deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_188);
    de::Random::~Random((Random *)local_124);
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &insertedCount);
  return extraout_EAX;
}

Assistant:

void RandomGroup::init (void)
{
	const int			numAttempts				= 300;

	static const int	attribCounts[]			= { 1, 2, 5 };
	static const float	attribWeights[]			= { 30, 10, 1 };
	static const int	primitiveCounts[]		= { 1, 5, 64 };
	static const float	primitiveCountWeights[]	= { 20, 10, 1 };
	static const int	indexOffsets[]			= { 0, 7, 13 };
	static const float	indexOffsetWeights[]	= { 20, 20, 1 };
	static const int	firsts[]				= { 0, 7, 13 };
	static const float	firstWeights[]			= { 20, 20, 1 };
	static const int	instanceCounts[]		= { 1, 2, 16, 17 };
	static const float	instanceWeights[]		= { 20, 10, 5, 1 };
	static const int	indexMins[]				= { 0, 1, 3, 8 };
	static const int	indexMaxs[]				= { 4, 8, 128, 257 };
	static const float	indexWeights[]			= { 50, 50, 50, 50 };
	static const int	offsets[]				= { 0, 1, 5, 12 };
	static const float	offsetWeights[]			= { 50, 10, 10, 10 };
	static const int	strides[]				= { 0, 7, 16, 17 };
	static const float	strideWeights[]			= { 50, 10, 10, 10 };
	static const int	instanceDivisors[]		= { 0, 1, 3, 129 };
	static const float	instanceDivisorWeights[]= { 70, 30, 10, 10 };

	static const gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	static const gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	static const gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
		gls::DrawTestSpec::INDEXTYPE_INT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	static const gls::DrawTestSpec::Storage storages[] =
	{
		gls::DrawTestSpec::STORAGE_USER,
		gls::DrawTestSpec::STORAGE_BUFFER,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(storages)> storageWeights;

	static const gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT,
		gls::DrawTestSpec::INPUTTYPE_INT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT,
		gls::DrawTestSpec::INPUTTYPE_HALF,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		gls::DrawTestSpec::INPUTTYPE_INT_2_10_10_10,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	static const gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
		gls::DrawTestSpec::OUTPUTTYPE_INT,
		gls::DrawTestSpec::OUTPUTTYPE_UINT,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC4,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	static const gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_READ,
		gls::DrawTestSpec::USAGE_STREAM_COPY,
		gls::DrawTestSpec::USAGE_STATIC_READ,
		gls::DrawTestSpec::USAGE_STATIC_COPY,
		gls::DrawTestSpec::USAGE_DYNAMIC_READ,
		gls::DrawTestSpec::USAGE_DYNAMIC_COPY,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	static const deUint32 blacklistedCases[]=
	{
		544,	//!< extremely narrow triangle
	};

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(3,0);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);
		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMins),			DE_ARRAY_END(indexMins),		indexWeights);
		spec.indexMax				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMaxs),			DE_ARRAY_END(indexMaxs),		indexWeights);
		spec.instanceCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(instanceCounts),	DE_ARRAY_END(instanceCounts),	instanceWeights);

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(instanceDivisors), DE_ARRAY_END(instanceDivisors), instanceDivisorWeights);
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end())
			{
				// Only properly aligned and not blacklisted cases
				if (spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET			&&
					spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE			&&
					!de::contains(DE_ARRAY_BEGIN(blacklistedCases), DE_ARRAY_END(blacklistedCases), hash))
				{
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				}
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}